

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O3

void Assimp::BaseImporter::TextFileToBuffer
               (IOStream *stream,vector<char,_std::allocator<char>_> *data,TextFileMode mode)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  runtime_error *prVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  size_type __new_size;
  
  if (stream == (IOStream *)0x0) {
    __assert_fail("nullptr != stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/BaseImporter.cpp"
                  ,0x1c0,
                  "static void Assimp::BaseImporter::TextFileToBuffer(IOStream *, std::vector<char> &, TextFileMode)"
                 );
  }
  iVar1 = (*stream->_vptr_IOStream[6])();
  __new_size = CONCAT44(extraout_var,iVar1);
  if (__new_size != 0 || mode != FORBID_EMPTY) {
    std::vector<char,_std::allocator<char>_>::reserve(data,__new_size + 1);
    std::vector<char,_std::allocator<char>_>::resize(data,__new_size);
    if (__new_size != 0) {
      iVar1 = (*stream->_vptr_IOStream[2])
                        (stream,(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                super__Vector_impl_data._M_start,1,__new_size);
      if (__new_size != CONCAT44(extraout_var_00,iVar1)) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_40[0] = local_30;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"File read error","");
        std::runtime_error::runtime_error(prVar2,(string *)local_40);
        *(undefined ***)prVar2 = &PTR__runtime_error_008bf448;
        __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      ConvertToUTF8(data);
    }
    local_40[0] = (undefined1 *)((ulong)local_40[0] & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(data,(char *)local_40);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"File is empty","");
  std::runtime_error::runtime_error(prVar2,(string *)local_40);
  *(undefined ***)prVar2 = &PTR__runtime_error_008bf448;
  __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BaseImporter::TextFileToBuffer(IOStream* stream,
    std::vector<char>& data,
    TextFileMode mode)
{
    ai_assert(nullptr != stream);

    const size_t fileSize = stream->FileSize();
    if (mode == FORBID_EMPTY) {
        if(!fileSize) {
            throw DeadlyImportError("File is empty");
        }
    }

    data.reserve(fileSize+1);
    data.resize(fileSize);
    if(fileSize > 0) {
        if(fileSize != stream->Read( &data[0], 1, fileSize)) {
            throw DeadlyImportError("File read error");
        }

        ConvertToUTF8(data);
    }

    // append a binary zero to simplify string parsing
    data.push_back(0);
}